

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

lua_Integer lua_tointeger(lua_State *L,int idx)

{
  int iVar1;
  TValue in_RAX;
  TValue *pTVar2;
  lua_Integer lVar3;
  TValue TVar4;
  TValue tmp;
  TValue local_8;
  
  local_8 = in_RAX;
  pTVar2 = index2adr(L,idx);
  TVar4 = (TValue)pTVar2->n;
  if (((ulong)(TVar4.it64 >> 0x2f) < 0xfffffffffffffff2) ||
     ((TVar4.it64 >> 0x2f == 0xfffffffffffffffb &&
      (iVar1 = lj_strscan_num((GCstr *)(TVar4.u64 & 0x7fffffffffff),&local_8), TVar4 = local_8,
      iVar1 != 0)))) {
    lVar3 = (lua_Integer)TVar4.n;
  }
  else {
    lVar3 = 0;
  }
  return lVar3;
}

Assistant:

LUA_API lua_Integer lua_tointeger(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  lua_Number n;
  if (LJ_LIKELY(tvisint(o))) {
    return intV(o);
  } else if (LJ_LIKELY(tvisnum(o))) {
    n = numV(o);
  } else {
    if (!(tvisstr(o) && lj_strscan_number(strV(o), &tmp)))
      return 0;
    if (tvisint(&tmp))
      return intV(&tmp);
    n = numV(&tmp);
  }
#if LJ_64
  return (lua_Integer)n;
#else
  return lj_num2int(n);
#endif
}